

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

uint get_start_mvpred_sad_cost(FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV start_mv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint8_t *puVar4;
  FULLPEL_MOTION_SEARCH_PARAMS *in_RDI;
  int unaff_retaddr;
  uint8_t *in_stack_00000008;
  uint start_mv_sad;
  uint8_t *best_address;
  buf_2d *ref;
  buf_2d *src;
  MV_COST_PARAMS *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  buf_2d *ref_address;
  buf_2d *src_00;
  
  src_00 = (in_RDI->ms_buffers).src;
  ref_address = (in_RDI->ms_buffers).ref;
  puVar4 = get_buf_from_fullmv((buf_2d *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                               (FULLPEL_MV *)in_stack_ffffffffffffffc8);
  iVar2 = (int)((ulong)puVar4 >> 0x20);
  iVar1 = mvsad_err_cost_((FULLPEL_MV *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
  if ((in_RDI->ms_buffers).second_pred == (uint8_t *)0x0) {
    iVar2 = get_mvpred_sad(in_RDI,src_00,(uint8_t *)ref_address,iVar2);
    uVar3 = iVar2 + iVar1;
  }
  else {
    iVar2 = get_mvpred_compound_sad
                      ((FULLPEL_MOTION_SEARCH_PARAMS *)ref,(buf_2d *)best_address,in_stack_00000008,
                       unaff_retaddr);
    uVar3 = iVar2 + iVar1;
  }
  return uVar3;
}

Assistant:

static inline unsigned int get_start_mvpred_sad_cost(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, FULLPEL_MV start_mv) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const uint8_t *best_address = get_buf_from_fullmv(ref, &start_mv);

  unsigned int start_mv_sad =
      mvsad_err_cost_(&start_mv, &ms_params->mv_cost_params);

  if (ms_params->ms_buffers.second_pred)
    start_mv_sad +=
        get_mvpred_compound_sad(ms_params, src, best_address, ref->stride);
  else
    start_mv_sad += get_mvpred_sad(ms_params, src, best_address, ref->stride);

  return start_mv_sad;
}